

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O1

void doFormatString<unsigned_long_const,unsigned_char>
               (wstringstream *stream,wchar_t *format,unsigned_long *first,uchar *rest)

{
  wchar_t wVar1;
  bool bVar2;
  wchar_t *local_38;
  wchar_t local_2c;
  
  local_38 = format;
  while( true ) {
    wVar1 = *local_38;
    if (wVar1 == L'\0') {
      return;
    }
    local_38 = local_38 + 1;
    if (wVar1 == L'%') break;
    local_2c = wVar1;
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
              ((wostream *)(stream + 0x10),&local_2c,1);
  }
  bVar2 = doFormatSetup(stream,&local_38);
  if (bVar2) {
    std::wostream::_M_insert<unsigned_long>((ulong)(stream + 0x10));
  }
  doFormatString<unsigned_char_const>(stream,local_38,rest);
  return;
}

Assistant:

void doFormatString(std::wstringstream& stream, const wchar_t* format, First& first, const Rest&... rest)
{
	while (*format != 0)
	{
		if (*format == '%')
		{
			format++;
			if (doFormatSetup(stream,format))
				stream << first;
			doFormatString(stream,format,rest...);
			return;
		}

		stream << *format++;
	}
}